

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_syst_inv.c
# Opt level: O0

_Bool test_syst_inv(int K_lower,int K_upper)

{
  bool bVar1;
  uint uVar2;
  void *__ptr;
  void *__ptr_00;
  int in_ESI;
  int in_EDI;
  int RUN_NOFAIL_err_3;
  RqInterProgram *interProg;
  int RUN_NOFAIL_err_2;
  int RUN_NOFAIL_err_1;
  RqInterWorkMem *interWork;
  int RUN_NOFAIL_err;
  size_t interSymNum;
  size_t interProgSize;
  size_t interWorkSize;
  int K;
  int i;
  int ntest;
  undefined1 local_30 [8];
  size_t local_28;
  size_t local_20;
  uint local_18;
  int local_14;
  uint local_10;
  int local_c;
  int local_8;
  
  local_c = in_ESI;
  local_8 = in_EDI;
  printf("Checking for invertibility from the K source symbols.\n");
  local_10 = 0;
  local_14 = 0;
  do {
    bVar1 = false;
    if (local_14 < 0x1dd) {
      bVar1 = Kprime[local_14] <= local_c;
    }
    if (!bVar1) {
      printf("--> Passed, %d values were tested.\n",(ulong)local_10);
      return true;
    }
    local_18 = Kprime[local_14];
    if (local_8 <= (int)local_18) {
      printf("--> Checking K=%d\n",(ulong)local_18);
      uVar2 = RqInterGetMemSizes(local_18,0,&local_20,&local_28,local_30);
      if ((int)uVar2 < 0) {
        fprintf(_stderr,"Error:%s:%d: %s failed: %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/rq_syst_inv.c"
                ,0x57,"RqInterGetMemSizes(K, 0, &interWorkSize, &interProgSize, &interSymNum)",
                (ulong)uVar2);
        return false;
      }
      __ptr = malloc(local_20);
      uVar2 = RqInterInit(local_18,0,__ptr,local_20);
      if ((int)uVar2 < 0) {
        fprintf(_stderr,"Error:%s:%d: %s failed: %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/rq_syst_inv.c"
                ,0x59,"RqInterInit(K, 0, interWork, interWorkSize)",(ulong)uVar2);
        return false;
      }
      uVar2 = RqInterAddIds(__ptr,0,local_18);
      if ((int)uVar2 < 0) {
        fprintf(_stderr,"Error:%s:%d: %s failed: %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/rq_syst_inv.c"
                ,0x5a,"RqInterAddIds(interWork, 0, K)",(ulong)uVar2);
        return false;
      }
      __ptr_00 = malloc(local_28);
      uVar2 = RqInterCompile(__ptr,__ptr_00,local_28);
      if ((int)uVar2 < 0) {
        fprintf(_stderr,"Error:%s:%d: %s failed: %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/rq_syst_inv.c"
                ,0x5c,"RqInterCompile(interWork, interProg, interProgSize)",(ulong)uVar2);
        return false;
      }
      free(__ptr_00);
      free(__ptr);
      local_10 = local_10 + 1;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool test_syst_inv(int K_lower, int K_upper)
{
	printf("Checking for invertibility from the K source symbols.\n");
	int ntest = 0;
	int i;
	for (i = 0; i < n_Kprime && Kprime[i] <= K_upper; ++i) {
		const int K = Kprime[i];
		if (K < K_lower)
			continue;
		printf("--> Checking K=%d\n", K);
		size_t interWorkSize, interProgSize, interSymNum;
#define RUN_NOFAIL(x) \
	do { \
		int RUN_NOFAIL_err; \
		if ((RUN_NOFAIL_err = (x)) < 0) { \
			fprintf(stderr, "Error:%s:%d: %s failed: %d.\n", \
				__FILE__, __LINE__, #x, RUN_NOFAIL_err); \
			return false; \
		} \
	} while(0)

		RUN_NOFAIL(RqInterGetMemSizes(K, 0,
		  &interWorkSize, &interProgSize, &interSymNum));
		RqInterWorkMem* interWork = malloc(interWorkSize);
		RUN_NOFAIL(RqInterInit(K, 0, interWork, interWorkSize));
		RUN_NOFAIL(RqInterAddIds(interWork, 0, K));
		RqInterProgram* interProg = malloc(interProgSize);
		RUN_NOFAIL(RqInterCompile(interWork, interProg, interProgSize));
#undef RUN_NOFAIL

		free(interProg);
		free(interWork);

		++ntest;
	}
	printf("--> Passed, %d values were tested.\n", ntest);
	return true;
}